

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  FieldDescriptor *this_00;
  CppType CVar1;
  LogMessage *other;
  GeneratorOptions *options_00;
  Descriptor *from_file;
  Descriptor *in_R8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  GeneratorOptions *local_20;
  FieldDescriptor *field_local;
  GeneratorOptions *options_local;
  
  local_20 = options;
  field_local = (FieldDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)options);
  local_59 = 0;
  if (CVar1 != CPPTYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x116);
    local_59 = 1;
    other = internal::LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE: ");
    internal::LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  this_00 = field_local;
  options_00 = (GeneratorOptions *)FieldDescriptor::file((FieldDescriptor *)local_20);
  from_file = FieldDescriptor::message_type((FieldDescriptor *)local_20);
  MaybeCrossFileRef_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)this_00,options_00,
             (FileDescriptor *)from_file,in_R8);
  return __return_storage_ptr__;
}

Assistant:

string SubmessageTypeRef(const GeneratorOptions& options,
                         const FieldDescriptor* field) {
  GOOGLE_CHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  return MaybeCrossFileRef(options, field->file(), field->message_type());
}